

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

char * __thiscall
Memory::LargeHeapBlock::AllocFreeListEntry
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes,
          LargeHeapBlockFreeListEntry *entry)

{
  LargeHeapBlockFreeListEntry *address;
  byte bVar1;
  uint uVar2;
  undefined4 *puVar3;
  size_t size_00;
  HeapInfo *pHVar4;
  code *pcVar5;
  bool bVar6;
  HeapInfo *heapInfo;
  LargeHeapBlockFreeListEntry *pLVar7;
  Recycler *pRVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  undefined6 in_register_00000012;
  uint uVar12;
  undefined8 *in_FS_OFFSET;
  
  uVar11 = (uint)CONCAT62(in_register_00000012,attributes);
  if (0x3ff < uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x204,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
  }
  if (size == 0 || (size & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x205,"(HeapInfo::IsAlignedSize(size))","HeapInfo::IsAlignedSize(size)");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
  }
  if ((attributes & TrackBit) != NoBit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x209,"((attributes & TrackBit) == 0)",
                       "Large tracked object collection not implemented");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
  }
  if (entry->heapBlock != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20b,"(entry->heapBlock == this)","entry->heapBlock == this");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
  }
  uVar12 = entry->headerIndex;
  if (this->objectCount <= uVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20c,"(entry->headerIndex < this->objectCount)",
                       "entry->headerIndex < this->objectCount");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
    uVar12 = entry->headerIndex;
  }
  if ((&this[1].super_HeapBlock._vptr_HeapBlock)[uVar12] != (_func_int **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x20d,"(this->HeaderList()[entry->headerIndex] == nullptr)",
                       "this->HeaderList()[entry->headerIndex] == nullptr");
    if (!bVar6) goto LAB_00245fb8;
    *puVar3 = 0;
    uVar12 = entry->headerIndex;
  }
  size_00 = entry->objectSize;
  address = entry + 1;
  pLVar7 = (LargeHeapBlockFreeListEntry *)((long)&entry[1].headerIndex + size);
  if ((pLVar7 < address || (LargeHeapBlockFreeListEntry *)this->addressEnd < pLVar7) ||
      (LargeHeapBlockFreeListEntry *)((long)&entry[1].headerIndex + size_00) < pLVar7) {
    return (char *)0x0;
  }
  if (this->heapInfo->recycler->verifyEnabled != false) {
    Recycler::VerifyCheckFill(address,size_00);
  }
  memset(entry,0,size_00 + 0x20);
  pRVar8 = this->heapInfo->recycler;
  if (pRVar8->verifyEnabled != false) {
    memset(address,0xca,size_00);
    pRVar8 = this->heapInfo->recycler;
  }
  if ((pRVar8->recyclerFlagsTable->Verbose == true) &&
     ((bVar6 = Js::Phases::IsEnabled(&pRVar8->recyclerFlagsTable->Trace,MemoryAllocationPhase),
      bVar6 || (bVar6 = Js::Phases::IsEnabled
                                  (&this->heapInfo->recycler->recyclerFlagsTable->Trace,
                                   LargeMemoryAllocationPhase), bVar6)))) {
    Output::Print(L"Allocated object of size 0x%x in from free list entry at address 0x%p\n",size,
                  address);
  }
  if (this->objectCount < this->allocCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x232,"(allocCount <= objectCount)","allocCount <= objectCount");
    if (!bVar6) {
LAB_00245fb8:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar3 = 0;
  }
  entry->headerIndex = uVar12;
  entry->objectSize = size_00;
  bVar1 = *(byte *)((long)&entry->next + 2);
  bVar9 = (byte)(uVar11 >> 7) & 2;
  *(byte *)((long)&entry->next + 2) = bVar1 & 0xfd | bVar9;
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    *(undefined ***)address = &PTR_Finalize_00357058;
  }
  uVar10 = this->heapInfo->recycler->Cookie;
  *(byte *)((long)&entry->next + 2) = bVar1 & 0xfc | bVar9;
  pHVar4 = this->heapInfo;
  uVar2 = pHVar4->recycler->Cookie;
  uVar10 = uVar10 ^ uVar2 ^ uVar11 << 8;
  *(ushort *)&entry->next = ((ushort)uVar10 & 0xff00 | (ushort)(uVar10 >> 8) & 0xff) ^ (ushort)uVar2
  ;
  entry->heapBlock = (LargeHeapBlock *)(ulong)uVar2;
  (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar12] = (_func_int **)entry;
  this->finalizeCount = this->finalizeCount + ((uVar11 & 0x80) >> 7);
  if ((attributes & FinalizeBit) != NoBit) {
    pHVar4->liveFinalizableObjectCount = pHVar4->liveFinalizableObjectCount + 1;
    pHVar4->newFinalizableObjectCount = pHVar4->newFinalizableObjectCount + 1;
  }
  return (char *)address;
}

Assistant:

char*
LargeHeapBlock::AllocFreeListEntry(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes, LargeHeapBlockFreeListEntry* entry)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
    Assert(HeapInfo::IsAlignedSize(size));
#ifdef RECYCLER_VISITED_HOST
    AssertMsg((attributes & TrackBit) == 0 || (attributes & RecyclerVisitedHostBit), "Large tracked object implemented just for recycler visited objects");
#else
    AssertMsg((attributes & TrackBit) == 0, "Large tracked object collection not implemented");
#endif
    Assert(entry->heapBlock == this);
    Assert(entry->headerIndex < this->objectCount);
    Assert(this->HeaderList()[entry->headerIndex] == nullptr);

    uint headerIndex = entry->headerIndex;
    size_t originalSize = entry->objectSize;

    LargeObjectHeader * header = (LargeObjectHeader *) entry;

    char * allocObject = ((char*) entry) + sizeof(LargeObjectHeader);       // shouldn't overflow
    char * newAllocAddressEnd = allocObject + size;
    char * originalAllocEnd = allocObject + originalSize;
    if (newAllocAddressEnd > addressEnd || newAllocAddressEnd < allocObject || (originalAllocEnd < newAllocAddressEnd))
    {
        return nullptr;
    }

#ifdef RECYCLER_MEMORY_VERIFY
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        this->heapInfo->recycler->VerifyCheckFill(allocObject , originalSize);
    }
#endif

    memset(entry, 0, sizeof(LargeObjectHeader) + originalSize);

#ifdef RECYCLER_MEMORY_VERIFY
    // If we're in recyclerVerify mode, fill the non-header part of the allocation
    // with the verification pattern
    if (this->heapInfo->recycler->VerifyEnabled())
    {
        memset(allocObject, Recycler::VerifyMemFill, originalSize);
    }
#endif

#if DBG
    LargeAllocationVerboseTrace(this->heapInfo->recycler->GetRecyclerFlagsTable(), _u("Allocated object of size 0x%x in from free list entry at address 0x%p\n"), size, allocObject);
#endif

    Assert(allocCount <= objectCount);

    header->objectIndex = headerIndex;
    header->objectSize = originalSize;
#ifdef RECYCLER_WRITE_BARRIER
    header->hasWriteBarrier = (attributes & WithBarrierBit) == WithBarrierBit;
#endif

    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
        allocObject = (char *)new (allocObject) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
        // On ARM, make sure the v-table write is performed before setting the attributes
        MemoryBarrier();
#endif
    }
    header->SetAttributes(this->heapInfo->recycler->Cookie, (attributes & StoredObjectInfoBitMask));
    header->markOnOOMRescan = false;
    header->SetNext(this->heapInfo->recycler->Cookie, nullptr);

    HeaderList()[headerIndex] = header;
    finalizeCount += ((attributes & FinalizeBit) != 0);

#ifdef RECYCLER_FINALIZE_CHECK
    if (attributes & FinalizeBit)
    {
        HeapInfo * heapInfo = this->heapInfo;
        heapInfo->liveFinalizableObjectCount++;
        heapInfo->newFinalizableObjectCount++;
    }
#endif

    return allocObject;
}